

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O1

void __thiscall libcellml::XmlDoc::~XmlDoc(XmlDoc *this)

{
  XmlDocImpl *pXVar1;
  
  if (this->mPimpl->mXmlDocPtr != (xmlDocPtr)0x0) {
    xmlFreeDoc();
  }
  pXVar1 = this->mPimpl;
  if (pXVar1 != (XmlDocImpl *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pXVar1->mXmlErrors);
    operator_delete(pXVar1,0x28);
    return;
  }
  return;
}

Assistant:

XmlDoc::~XmlDoc()
{
    if (mPimpl->mXmlDocPtr != nullptr) {
        xmlFreeDoc(mPimpl->mXmlDocPtr);
    }
    delete mPimpl;
}